

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcChain.c
# Opt level: O3

Gia_Man_t * Gia_ManDupWithInit(Gia_Man_t *p)

{
  uint uVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pName = pcVar7;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p_00->pSpec = pcVar7;
  p->pObjs->Value = 0;
  if (1 < p->nObjs) {
    lVar16 = 1;
    lVar14 = 0x14;
    do {
      pGVar3 = p->pObjs;
      uVar18 = *(ulong *)((long)pGVar3 + lVar14 + -8);
      uVar15 = (uint)uVar18;
      iVar5 = (int)(uVar18 & 0x1fffffff);
      if ((uVar18 & 0x1fffffff) == 0x1fffffff || (int)uVar15 < 0) {
        if ((uVar15 & 0x9fffffff) == 0x9fffffff) {
          pGVar9 = Gia_ManAppendObj(p_00);
          uVar18 = *(ulong *)pGVar9;
          *(ulong *)pGVar9 = uVar18 | 0x9fffffff;
          *(ulong *)pGVar9 =
               uVar18 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) {
LAB_0050cd9f:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * -0x55555555);
          pGVar8 = p_00->pObjs;
          if ((pGVar9 < pGVar8) || (pGVar8 + p_00->nObjs <= pGVar9)) goto LAB_0050cd9f;
          uVar15 = (int)((ulong)((long)pGVar9 - (long)pGVar8) >> 2) * 0x55555556;
          *(uint *)(&pGVar3->field_0x0 + lVar14) = uVar15;
          if ((int)uVar15 < 0) goto LAB_0050cdbe;
          *(uint *)(&pGVar3->field_0x0 + lVar14) =
               *(uint *)((long)pGVar3 + lVar14 + -8) >> 0x1e & 1 | uVar15;
        }
        else if ((int)uVar15 < 0 && iVar5 != 0x1fffffff) {
          uVar17 = *(uint *)((long)pGVar3 + lVar14 + (ulong)(uint)(iVar5 << 2) * -3);
          if ((int)uVar17 < 0) goto LAB_0050cdbe;
          uVar17 = uVar17 ^ (uVar15 >> 0x1e ^ (uint)(uVar18 >> 0x1d) & 7) & 1;
          *(uint *)(&pGVar3->field_0x0 + lVar14) = uVar17;
          iVar5 = Gia_ManAppendCo(p_00,uVar17);
          *(int *)(&pGVar3->field_0x0 + lVar14) = iVar5;
        }
      }
      else {
        uVar15 = *(uint *)((long)pGVar3 + lVar14 + (ulong)(uint)(iVar5 << 2) * -3);
        if ((int)uVar15 < 0) {
LAB_0050cdbe:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10f,"int Abc_LitNotCond(int, int)");
        }
        uVar17 = *(uint *)((long)pGVar3 + lVar14 + (ulong)((uint)(uVar18 >> 0x1e) & 0x7ffffffc) * -3
                          );
        if ((int)uVar17 < 0) goto LAB_0050cdbe;
        pGVar8 = Gia_ManAppendObj(p_00);
        uVar10 = uVar15 >> 1;
        uVar1 = p_00->nObjs;
        if ((int)uVar1 <= (int)uVar10) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x267,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar4 = uVar17 >> 1;
        if (uVar1 <= uVar4) {
          __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x268,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        if (uVar10 == uVar4) {
          __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                        ,0x269,"int Gia_ManAppendAnd(Gia_Man_t *, int, int)");
        }
        uVar15 = uVar15 ^ (uint)(uVar18 >> 0x1d) & 1;
        uVar17 = uVar17 ^ (uint)(uVar18 >> 0x3d) & 1;
        pGVar9 = p_00->pObjs;
        iVar5 = (int)pGVar8;
        if (uVar15 < uVar17) {
          if (pGVar9 + uVar1 <= pGVar8 || pGVar8 < pGVar9) goto LAB_0050cd9f;
          uVar18 = *(ulong *)pGVar8;
          uVar11 = (ulong)((uVar15 & 1) << 0x1d |
                          ((uint)(iVar5 - (int)pGVar9) >> 2) * -0x55555555 - uVar10 & 0x1fffffff);
          *(ulong *)pGVar8 = uVar11 | uVar18 & 0xffffffffc0000000;
          pGVar9 = p_00->pObjs;
          if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_0050cd9f;
          uVar18 = (ulong)(uVar17 & 1) << 0x3d |
                   (ulong)(((uint)(iVar5 - (int)pGVar9) >> 2) * -0x55555555 - uVar4 & 0x1fffffff) <<
                   0x20 | uVar11 | uVar18 & 0xc0000000c0000000;
        }
        else {
          if (pGVar9 + uVar1 <= pGVar8 || pGVar8 < pGVar9) goto LAB_0050cd9f;
          uVar11 = (ulong)(((uint)(iVar5 - (int)pGVar9) >> 2) * -0x55555555 - uVar10 & 0x1fffffff)
                   << 0x20;
          uVar18 = *(ulong *)pGVar8;
          uVar12 = (ulong)(uVar15 & 1) << 0x3d;
          *(ulong *)pGVar8 = uVar12 | uVar18 & 0xc0000000ffffffff | uVar11;
          pGVar9 = p_00->pObjs;
          if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_0050cd9f;
          uVar18 = (ulong)((uVar17 & 1) << 0x1d) | uVar12 | uVar18 & 0xc0000000c0000000 | uVar11 |
                   (ulong)(((uint)(iVar5 - (int)pGVar9) >> 2) * -0x55555555 - uVar4 & 0x1fffffff);
        }
        *(ulong *)pGVar8 = uVar18;
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar8 + -(uVar18 & 0x1fffffff),pGVar8);
          Gia_ObjAddFanout(p_00,pGVar8 + -((ulong)*(uint *)&pGVar8->field_0x4 & 0x1fffffff),pGVar8);
        }
        if (p_00->fSweeper != 0) {
          uVar11 = *(ulong *)pGVar8 & 0x1fffffff;
          uVar18 = *(ulong *)pGVar8 >> 0x20 & 0x1fffffff;
          uVar12 = 0x4000000000000000;
          if (((uint)*(ulong *)(pGVar8 + -uVar11) >> 0x1e & 1) == 0) {
            uVar12 = 0x40000000;
          }
          *(ulong *)(pGVar8 + -uVar11) = uVar12 | *(ulong *)(pGVar8 + -uVar11);
          uVar12 = *(ulong *)(pGVar8 + -uVar18);
          uVar13 = 0x4000000000000000;
          if (((uint)uVar12 >> 0x1e & 1) == 0) {
            uVar13 = 0x40000000;
          }
          *(ulong *)(pGVar8 + -uVar18) = uVar13 | uVar12;
          uVar18 = *(ulong *)pGVar8;
          *(ulong *)pGVar8 =
               uVar18 & 0x7fffffffffffffff |
               (ulong)(((uint)(uVar18 >> 0x3d) ^ (uint)(uVar12 >> 0x3f)) &
                      ((uint)((ulong)*(undefined8 *)(pGVar8 + -uVar11) >> 0x3f) ^
                      (uint)(uVar18 >> 0x1d) & 7)) << 0x3f;
        }
        pGVar9 = p_00->pObjs;
        if ((pGVar8 < pGVar9) || (pGVar9 + p_00->nObjs <= pGVar8)) goto LAB_0050cd9f;
        *(int *)(&pGVar3->field_0x0 + lVar14) =
             (int)((ulong)((long)pGVar8 - (long)pGVar9) >> 2) * 0x55555556;
      }
      lVar16 = lVar16 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar16 < p->nObjs);
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupWithInit( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObj->Value = Gia_ManAppendCi( pNew );
            pObj->Value = Abc_LitNotCond( pObj->Value, pObj->fMark0 );
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pObj->Value = Gia_ObjFanin0Copy(pObj);
            pObj->Value = Abc_LitNotCond( pObj->Value, pObj->fMark0 );
            pObj->Value = Gia_ManAppendCo( pNew, pObj->Value );
        }
    }
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}